

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::GetAsyncCommandResponse_SetupDataSource::
~GetAsyncCommandResponse_SetupDataSource(GetAsyncCommandResponse_SetupDataSource *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Head_base<0UL,_perfetto::protos::gen::DataSourceConfig_*,_false> _Var3;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GetAsyncCommandResponse_SetupDataSource_003a3480;
  pcVar2 = (this->unknown_fields_)._M_dataplus._M_p;
  paVar1 = &(this->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->config_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::DataSourceConfig,_std::default_delete<perfetto::protos::gen::DataSourceConfig>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::DataSourceConfig_*,_std::default_delete<perfetto::protos::gen::DataSourceConfig>_>
       .super__Head_base<0UL,_perfetto::protos::gen::DataSourceConfig_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (DataSourceConfig *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_CppMessageObj + 8))();
  }
  (this->config_).ptr_._M_t.
  super___uniq_ptr_impl<perfetto::protos::gen::DataSourceConfig,_std::default_delete<perfetto::protos::gen::DataSourceConfig>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::protos::gen::DataSourceConfig_*,_std::default_delete<perfetto::protos::gen::DataSourceConfig>_>
  .super__Head_base<0UL,_perfetto::protos::gen::DataSourceConfig_*,_false>._M_head_impl =
       (DataSourceConfig *)0x0;
  return;
}

Assistant:

GetAsyncCommandResponse_SetupDataSource::~GetAsyncCommandResponse_SetupDataSource() = default;